

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1-cxx.cpp
# Opt level: O3

bool __thiscall Secp256K1::createPublicKey(Secp256K1 *this,bool compressed)

{
  int iVar1;
  size_t outSize;
  secp256k1_pubkey pubkey;
  size_t local_70;
  secp256k1_pubkey local_68;
  
  iVar1 = secp256k1_ec_pubkey_create
                    (this->ctx,&local_68,
                     (this->privKey).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start);
  if (iVar1 == 1) {
    local_70 = 0x41;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->pubKey,0x41);
    secp256k1_ec_pubkey_serialize
              (this->ctx,
               (this->pubKey).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start,&local_70,&local_68,
               (uint)compressed << 8 | 2);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->pubKey,local_70);
  }
  return iVar1 == 1;
}

Assistant:

bool Secp256K1::createPublicKey(bool compressed)
{
    // Calculate public key.
    secp256k1_pubkey pubkey;
    int ret = secp256k1_ec_pubkey_create(ctx, &pubkey, privKey.data());
    if (ret != 1) {
        return false;
    }

    // Serialize public key.
    size_t outSize = PUBLIC_KEY_SIZE;
    pubKey.resize(outSize);
    secp256k1_ec_pubkey_serialize(
        ctx, pubKey.data(), &outSize, &pubkey,
        compressed ? SECP256K1_EC_COMPRESSED : SECP256K1_EC_UNCOMPRESSED);
    pubKey.resize(outSize);

    // Succeed.
    return true;
}